

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeView::visualIndex(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  int iVar1;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  iVar1 = QTreeViewPrivate::viewIndex(this_00,index);
  return iVar1;
}

Assistant:

int QTreeView::visualIndex(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    return d->viewIndex(index);
}